

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O0

void __thiscall NaPNFetcher::action(NaPNFetcher *this)

{
  undefined8 uVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long in_RDI;
  int i_1;
  NaReal fSum;
  int i;
  NaPetriCnInput *in_stack_ffffffffffffffc8;
  NaPetriCnInput *this_00;
  int local_1c;
  double local_18;
  uint local_c;
  
  if (*(long *)(in_RDI + 0x118) == 0) {
    for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x120); local_c = local_c + 1) {
      pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
      iVar2 = (*pNVar3->_vptr_NaVector[8])
                        (pNVar3,(ulong)*(uint *)(*(long *)(in_RDI + 0x110) + (long)(int)local_c * 4)
                        );
      uVar1 = *(undefined8 *)CONCAT44(extraout_var,iVar2);
      pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
      iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,(ulong)local_c);
      *(undefined8 *)CONCAT44(extraout_var_00,iVar2) = uVar1;
    }
  }
  else {
    local_18 = 0.0;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x120); local_1c = local_1c + 1) {
      this_00 = *(NaPetriCnInput **)(*(long *)(in_RDI + 0x118) + (long)local_1c * 8);
      pNVar3 = NaPetriCnInput::data(this_00);
      iVar2 = (*pNVar3->_vptr_NaVector[8])();
      local_18 = (double)this_00 * *(double *)CONCAT44(extraout_var_01,iVar2) + local_18;
    }
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x90));
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(double *)CONCAT44(extraout_var_02,iVar2) = local_18;
  }
  return;
}

Assistant:

void
NaPNFetcher::action ()
{
  if(NULL == pfSumWeights)
    {
      int	i;
      for(i = 0; i < nOutDim; ++i){
	out.data()[i] = in.data()[piOutMap[i]];
      }
    }
  else
    {
      NaReal	fSum = 0.0;
      int	i;
      for(i = 0; i < nOutDim; ++i){
	fSum += pfSumWeights[i] * in.data()[piOutMap[i]];
      }
      out.data()[0] = fSum;
    }
}